

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void searchlight_mask_test(tgestate_t *state,vischar_t *vischar)

{
  char *pcVar1;
  tgestate_t *in_RSI;
  long in_RDI;
  uint8_t iters;
  attribute_t attrs;
  uint8_t *buf;
  uint6 in_stack_ffffffffffffffe0;
  char cVar2;
  undefined1 in_stack_ffffffffffffffe7;
  
  if (in_RSI <= (tgestate_t *)(in_RDI + 0x3c0U)) {
    pcVar1 = (char *)(in_RDI + 0x5f1);
    cVar2 = '\b';
    do {
      if (*pcVar1 != '\0') {
        *(undefined1 *)(in_RDI + 0x693) = 0x1f;
        return;
      }
      pcVar1 = pcVar1 + 4;
      cVar2 = cVar2 + -1;
    } while (cVar2 != '\0');
    cVar2 = *(char *)(in_RDI + 0x693) + -1;
    *(char *)(in_RDI + 0x693) = cVar2;
    if (cVar2 == -1) {
      choose_game_window_attributes
                ((tgestate_t *)CONCAT17(in_stack_ffffffffffffffe7,(uint7)in_stack_ffffffffffffffe0))
      ;
      set_game_window_attributes(in_RSI,(attribute_t)((ulong)pcVar1 >> 0x38));
    }
  }
  return;
}

Assistant:

void searchlight_mask_test(tgestate_t *state, vischar_t *vischar)
{
  uint8_t     *buf;   /* was HL */
  attribute_t  attrs; /* was A */
  uint8_t      iters; /* was B */
  //uint8_t      C;     /* was C */

  assert(state != NULL);
  ASSERT_VISCHAR_VALID(vischar);

  if (vischar > &state->vischars[0])
    return; /* Skip non-hero characters. */

  /* Start testing at approximately the middle of the character. */
  buf = &state->mask_buffer[32 + 16 + 1]; /* x=1, y=12 */
  iters = 8;
  /* BUG: Original code does a fused load of BC, but doesn't use C after.
   * Probably a leftover stride constant for MASK_BUFFER_WIDTHBYTES. */
  // C = 4;
  do
  {
    if (*buf != 0)
      goto still_in_searchlight;
    buf += MASK_BUFFER_WIDTHBYTES;
  }
  while (--iters);

  /* Otherwise the hero has escaped the searchlight, so decrement the
   * counter. */
  if (--state->searchlight_state == searchlight_STATE_SEARCHING)
  {
    attrs = choose_game_window_attributes(state);
    set_game_window_attributes(state, attrs);
  }

  return;

still_in_searchlight:
  state->searchlight_state = searchlight_STATE_CAUGHT;
}